

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O2

double lj_vm_foldarith(double x,double y,int op)

{
  double dVar1;
  
  switch(op) {
  case 0:
    return x + y;
  case 1:
    return x - y;
  case 2:
    return x * y;
  case 3:
    return x / y;
  case 4:
    dVar1 = lj_vm_floormul(x,y);
    return x - dVar1;
  case 5:
    dVar1 = pow(x,y);
    return dVar1;
  case 6:
    return -x;
  case 7:
    return ABS(x);
  case 8:
    dVar1 = ldexp(x,(int)y);
    return dVar1;
  case 9:
    if (y <= x) {
      x = y;
    }
    return x;
  case 10:
    if (x <= y) {
      x = y;
    }
  }
  return x;
}

Assistant:

double lj_vm_foldarith(double x, double y, int op)
{
  switch (op) {
  case IR_ADD - IR_ADD: return x+y; break;
  case IR_SUB - IR_ADD: return x-y; break;
  case IR_MUL - IR_ADD: return x*y; break;
  case IR_DIV - IR_ADD: return x/y; break;
  case IR_MOD - IR_ADD: return x-lj_vm_floormul(x, y); break;
  case IR_POW - IR_ADD: return pow(x, y); break;
  case IR_NEG - IR_ADD: return -x; break;
  case IR_ABS - IR_ADD: return fabs(x); break;
#if LJ_HASJIT
  case IR_LDEXP - IR_ADD: return ldexp(x, (int)y); break;
  case IR_MIN - IR_ADD: return x < y ? x : y; break;
  case IR_MAX - IR_ADD: return x > y ? x : y; break;
#endif
  default: return x;
  }
}